

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

void rw::correctPathCase(char *filename)

{
  int iVar1;
  char *pcVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  char copy [1024];
  undefined2 local_838;
  char local_836 [1022];
  char local_438;
  char local_437 [1031];
  
  memset(&local_838,0,0x400);
  local_838 = CONCAT11(local_838._1_1_,0x2e);
  pcVar2 = &local_438;
  strncpy(pcVar2,filename,0x400);
  if (*filename == '/') {
    local_838 = 0x2f2f;
    pcVar2 = local_437;
  }
  pcVar2 = strtok(pcVar2,"/");
  do {
    if (pcVar2 == (char *)0x0) {
      strcpy(filename,local_836);
      return;
    }
    __dirp = opendir((char *)&local_838);
    do {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) {
        closedir(__dirp);
        return;
      }
      iVar1 = strncmp_ci(pdVar3->d_name,pcVar2,0x400);
    } while (iVar1 != 0);
    sVar4 = strlen((char *)&local_838);
    (local_836 + (sVar4 - 2))[0] = '/';
    (local_836 + (sVar4 - 2))[1] = '\0';
    strncat((char *)&local_838,pdVar3->d_name,0x400);
    closedir(__dirp);
    pcVar2 = strtok((char *)0x0,"/");
  } while( true );
}

Assistant:

void
correctPathCase(char *filename)
{
#ifdef __unix__
	DIR *direct;
	struct dirent *dirent;

	char *dir, *arg;
	char copy[1024], sofar[1024] = ".";
	strncpy(copy, filename, 1024);
	arg = copy;
	// hack for absolute paths
	if(filename[0] == '/'){
		sofar[0] = '/';
		sofar[1] = '/';
		sofar[2] = '\0';
		arg++;
	}
	while((dir = strtok(arg, PSEP_S))){
		arg = nil;
		if(direct = opendir(sofar), dir == nil)
			return;
		while(dirent = readdir(direct), dirent != nil)
			if(strncmp_ci(dirent->d_name, dir, 1024) == 0){
				strncat(sofar, PSEP_S, 1024);
				strncat(sofar, dirent->d_name, 1024);
				break;
			}
		closedir(direct);
		if(dirent == nil)
			return;
	}
	strcpy(filename, sofar+2);
#endif
}